

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
visitor_test_should_stop_when_encountering_invalid_fix_version_Test::TestBody
          (visitor_test_should_stop_when_encountering_invalid_fix_version_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  undefined1 local_a0 [8];
  VisitError<typename_AssertVisitor::ResultType> error;
  ErrorKind errorKind;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  Fixpp::visit<AssertVisitor,AssertVisitRules>
            (local_a0,(Fixpp *)"8=FIX.5.1|9=0000|35=0|49=Prov|56=MDABC|10=213",0x2d,
             &error.storage_.initialized_);
  errorKind.str_.field_2._M_local_buf[8] = local_a0[0] ^ 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_a0[0] == true) {
    testing::Message::Message((Message *)&local_18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error.storage_.initialized_,
               (internal *)(errorKind.str_.field_2._M_local_buf + 8),
               (AssertionResult *)"error.isOk()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,799,(char *)CONCAT44(error.storage_._52_4_,error.storage_._48_4_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((size_t *)CONCAT44(error.storage_._52_4_,error.storage_._48_4_) != &errorKind.column_) {
      operator_delete((undefined1 *)CONCAT44(error.storage_._52_4_,error.storage_._48_4_),
                      errorKind.column_ + 1);
    }
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    Fixpp::result::Result<void,_Fixpp::ErrorKind>::unwrapErr
              ((ErrorKind *)&error.storage_.initialized_,(Result<void,_Fixpp::ErrorKind> *)local_a0)
    ;
    local_18.ptr_._0_1_ = error.storage_.initialized_;
    local_18.ptr_._1_3_ = error.storage_._49_3_;
    gtest_ar_.message_.ptr_._0_4_ = 4;
    testing::internal::CmpHelperEQ<Fixpp::ErrorKind::Type,Fixpp::ErrorKind::Type>
              ((internal *)(errorKind.str_.field_2._M_local_buf + 8),"errorKind.type()",
               "Fixpp::ErrorKind::InvalidVersion",(Type *)&local_18,(Type *)&gtest_ar_.message_);
    if (errorKind.str_.field_2._M_local_buf[8] == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar_._0_8_ == 0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x322,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_18.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_18.ptr_ + 8))();
        }
        local_18.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((size_type *)errorKind.column_ != &errorKind.str_._M_string_length) {
      operator_delete((void *)errorKind.column_,errorKind.str_._M_string_length + 1);
    }
  }
  if (((local_a0[0] == false) && (error.storage_.storage_.__data[0x28] == '\x01')) &&
     ((undefined1 *)error.storage_.storage_._8_8_ !=
      (undefined1 *)((long)&error.storage_.storage_ + 0x18))) {
    operator_delete((void *)error.storage_.storage_._8_8_,error.storage_.storage_._24_8_ + 1);
  }
  return;
}

Assistant:

TEST(visitor_test, should_stop_when_encountering_invalid_fix_version)
{
    const char* frame = "8=FIX.5.1|9=0000|35=0|49=Prov|56=MDABC|10=213";

    auto error = doVisit(frame, AssertVisitor(), AssertVisitRules());
    ASSERT_FALSE(error.isOk());

    auto errorKind = error.unwrapErr();
    ASSERT_EQ(errorKind.type(), Fixpp::ErrorKind::InvalidVersion);
}